

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

cio_error stream_write(cio_io_stream *stream,cio_write_buffer *buffer,
                      cio_io_stream_write_handler_t handler,void *handler_context)

{
  bool bVar1;
  cio_error cVar2;
  size_t sVar3;
  int *piVar4;
  size_t sVar5;
  bool bVar6;
  size_t sVar7;
  cio_write_buffer *pcVar8;
  
  cVar2 = CIO_INVALID_ARGUMENT;
  if (((stream != (cio_io_stream *)0x0) && (buffer != (cio_write_buffer *)0x0)) &&
     (handler != (cio_io_stream_write_handler_t)0x0)) {
    sVar5 = (buffer->data).head.q_len;
    if (sVar5 == 0) {
      sVar7 = 0;
      bVar6 = false;
    }
    else {
      pcVar8 = buffer->next;
      bVar6 = false;
      sVar7 = 0;
      do {
        sVar5 = sVar5 - 1;
        sVar3 = write(*(int *)&stream[0x3a].read_handler_context,
                      (pcVar8->data).element.field_0.const_data,(pcVar8->data).element.length);
        bVar1 = true;
        if ((long)sVar3 < 0) {
          bVar6 = true;
        }
        else {
          sVar7 = sVar7 + sVar3;
          if (sVar3 == (pcVar8->data).element.length) {
            pcVar8 = pcVar8->next;
            bVar1 = false;
          }
        }
      } while ((!bVar1) && (sVar5 != 0));
    }
    if (bVar6) {
      piVar4 = __errno_location();
      if (*piVar4 == 0xb) {
        stream->write_handler = handler;
        stream->write_handler_context = handler_context;
        stream->write_buffer = buffer;
        stream[0x3a].read_handler = (cio_io_stream_read_handler_t)stream;
        stream[0x3a].close = write_callback;
        cVar2 = cio_linux_eventloop_register_write
                          ((cio_eventloop *)stream[0x3a].read_buffer,
                           (cio_event_notifier *)&stream[0x3a].write_some);
        return cVar2;
      }
      cVar2 = -*piVar4;
    }
    else {
      cVar2 = CIO_SUCCESS;
      (*handler)(stream,handler_context,buffer,CIO_SUCCESS,sVar7);
    }
  }
  return cVar2;
}

Assistant:

static enum cio_error stream_write(struct cio_io_stream *stream, struct cio_write_buffer *buffer, cio_io_stream_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_uart *uart = cio_container_of(stream, struct cio_uart, stream);
	size_t chain_length = cio_write_buffer_get_num_buffer_elements(buffer);

	const struct cio_write_buffer *write_buffer = buffer->next;
	size_t written = 0;
	bool write_error = false;
	for (size_t i = 0; i < chain_length; i++) {
		ssize_t ret = write(uart->impl.ev.fd, write_buffer->data.element.data, write_buffer->data.element.length);
		if (cio_likely(ret >= 0)) {
			written += (size_t)ret;
			if ((size_t)ret != write_buffer->data.element.length) {
				break;
			}
		} else {
			write_error = true;
			break;
		}

		write_buffer = write_buffer->next;
	}

	if (cio_likely(!write_error)) {
		handler(stream, handler_context, buffer, CIO_SUCCESS, written);
		return CIO_SUCCESS;
	}

	if (cio_likely(errno == EAGAIN)) {
		uart->stream.write_handler = handler;
		uart->stream.write_handler_context = handler_context;
		uart->stream.write_buffer = buffer;
		uart->impl.ev.context = stream;
		uart->impl.ev.write_callback = write_callback;
		return cio_linux_eventloop_register_write(uart->impl.loop, &uart->impl.ev);
	}

	return (enum cio_error)(-errno);
}